

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundParser.cpp
# Opt level: O1

bool __thiscall
BackgroundParser::ParseBackgroundItem
          (BackgroundParser *this,Parser *parser,ParseNodeFnc *parseNode,bool isDeferred)

{
  ThreadContextId pvVar1;
  code *pcVar2;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> item;
  bool bVar3;
  ThreadContextId pvVar4;
  undefined4 *puVar5;
  BasePtr<BackgroundParseItem> this_00;
  JobProcessor *this_01;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> local_38;
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator> workItemAutoPtr;
  
  pvVar1 = this->mainThreadId;
  pvVar4 = JsUtil::ExternalApi::GetCurrentThreadContextId();
  if (pvVar1 != pvVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/BackgroundParser.cpp"
                       ,0xa1,"(mainThreadId == GetCurrentThreadContextId())",
                       "Cannot use this member of BackgroundParser from thread other than the creating context\'s current thread"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  this_00.ptr = (BackgroundParseItem *)
                new<Memory::ArenaAllocator>(0xb0,&parser->m_nodeAllocator,0x366bee);
  BackgroundParseItem::BackgroundParseItem
            (this_00.ptr,(JobManager *)this,parser,parseNode,isDeferred);
  Parser::AddBackgroundParseItem(parser,this_00.ptr);
  local_38.super_BasePtr<BackgroundParseItem>.ptr =
       (BasePtr<BackgroundParseItem>)(BasePtr<BackgroundParseItem>)this_00.ptr;
  if (this_00.ptr != (BackgroundParseItem *)0x0) {
    Parser::PrepareForBackgroundParse(parser);
    item.super_BasePtr<BackgroundParseItem>.ptr = local_38.super_BasePtr<BackgroundParseItem>.ptr;
    local_38.super_BasePtr<BackgroundParseItem>.ptr =
         (BasePtr<BackgroundParseItem>)(BackgroundParseItem *)0x0;
    this_01 = JsUtil::JobManager::Processor((JobManager *)this);
    bVar3 = JsUtil::JobProcessor::ProcessesInBackground(this_01);
    AddToParseQueue(this,(BackgroundParseItem *)item.super_BasePtr<BackgroundParseItem>.ptr,false,
                    bVar3);
  }
  AutoPtr<BackgroundParseItem,_Memory::HeapAllocator>::~AutoPtr(&local_38);
  return this_00.ptr != (BackgroundParseItem *)0x0;
}

Assistant:

bool BackgroundParser::ParseBackgroundItem(Parser *parser, ParseNodeFnc *parseNode, bool isDeferred)
{
    ASSERT_THREAD();

    AutoPtr<BackgroundParseItem> workItemAutoPtr(this->NewBackgroundParseItem(parser, parseNode, isDeferred));
    if ((BackgroundParseItem*) workItemAutoPtr == nullptr)
    {
        // OOM, just skip this work item and return.
        // TODO: Raise an OOM parse-time exception.
        return false;
    }

    parser->PrepareForBackgroundParse();

    BackgroundParseItem * backgroundItem = workItemAutoPtr.Detach();
    this->AddToParseQueue(backgroundItem, false, this->Processor()->ProcessesInBackground());

    return true;
}